

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O3

void __thiscall cmCTestLaunchReporter::WriteXMLCommand(cmCTestLaunchReporter *this,cmXMLElement *e2)

{
  pointer pbVar1;
  cmXMLElement cVar2;
  pointer content;
  char *__end;
  cmXMLElement e3;
  cmXMLElement local_58;
  string local_50;
  
  cmXMLWriter::Comment(e2->xmlwr,"Details of command");
  cmXMLElement::cmXMLElement(&local_58,e2,"Command");
  if ((this->CWD)._M_string_length != 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"WorkingDirectory","");
    cVar2.xmlwr = local_58.xmlwr;
    cmXMLWriter::StartElement(local_58.xmlwr,&local_50);
    cmXMLWriter::Content<std::__cxx11::string>(cVar2.xmlwr,&this->CWD);
    cmXMLWriter::EndElement(cVar2.xmlwr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  content = (this->RealArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->RealArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (content != pbVar1) {
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Argument","");
      cVar2.xmlwr = local_58.xmlwr;
      cmXMLWriter::StartElement(local_58.xmlwr,&local_50);
      cmXMLWriter::Content<std::__cxx11::string>(cVar2.xmlwr,content);
      cmXMLWriter::EndElement(cVar2.xmlwr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      content = content + 1;
    } while (content != pbVar1);
  }
  cmXMLWriter::EndElement(local_58.xmlwr);
  return;
}

Assistant:

void cmCTestLaunchReporter::WriteXMLCommand(cmXMLElement& e2)
{
  e2.Comment("Details of command");
  cmXMLElement e3(e2, "Command");
  if (!this->CWD.empty()) {
    e3.Element("WorkingDirectory", this->CWD);
  }
  for (std::string const& realArg : this->RealArgs) {
    e3.Element("Argument", realArg);
  }
}